

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

void __thiscall
amrex::BaseFab<amrex::EBCellFlag>::resize(BaseFab<amrex::EBCellFlag> *this,Box *b,int n,Arena *ar)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Arena *pAVar5;
  Arena *pAVar6;
  Long LVar7;
  long lVar8;
  DataAllocator local_20;
  
  this->nvar = n;
  uVar2 = *(undefined8 *)((b->smallend).vect + 2);
  uVar3 = *(undefined8 *)(b->bigend).vect;
  uVar4 = *(undefined8 *)((b->bigend).vect + 2);
  *(undefined8 *)(this->domain).smallend.vect = *(undefined8 *)(b->smallend).vect;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar2;
  *(undefined8 *)(this->domain).bigend.vect = uVar3;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar4;
  if (ar == (Arena *)0x0) {
    ar = (this->super_DataAllocator).m_arena;
  }
  pAVar5 = DataAllocator::arena(&this->super_DataAllocator);
  local_20.m_arena = ar;
  pAVar6 = DataAllocator::arena(&local_20);
  if (pAVar5 == pAVar6) {
    if ((this->dptr == (EBCellFlag *)0x0) || (this->ptr_owner == false)) {
      if (this->shared_memory == true) {
        Abort_host("BaseFab::resize: BaseFab in shared memory cannot increase size");
      }
      this->dptr = (EBCellFlag *)0x0;
    }
    else {
      iVar1 = this->nvar;
      LVar7 = Box::numPts(&this->domain);
      lVar8 = LVar7 * iVar1;
      if (lVar8 - this->truesize == 0 || lVar8 < this->truesize) {
        return;
      }
      if (this->shared_memory == true) {
        Abort_host("BaseFab::resize: BaseFab in shared memory cannot increase size");
      }
      clear(this);
    }
  }
  else {
    clear(this);
    (this->super_DataAllocator).m_arena = ar;
  }
  define(this);
  return;
}

Assistant:

void
BaseFab<T>::resize (const Box& b, int n, Arena* ar)
{
    this->nvar   = n;
    this->domain = b;

    if (ar == nullptr) {
        ar = m_arena;
    }

    if (arena() != DataAllocator(ar).arena()) {
        clear();
        m_arena = ar;
        define();
    }
    else if (this->dptr == 0 || !this->ptr_owner)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        this->dptr = nullptr;
        define();
    }
    else if (this->nvar*this->domain.numPts() > this->truesize)
    {
        if (this->shared_memory)
            amrex::Abort("BaseFab::resize: BaseFab in shared memory cannot increase size");

        clear();

        define();
    }
}